

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall CVmObjBigNum::compare_to(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  undefined8 *in_RDX;
  char *in_RDI;
  vm_val_t val2;
  vm_val_t *in_stack_ffffffffffffffc8;
  CVmObjBigNum *this_00;
  
  this_00 = (CVmObjBigNum *)*in_RDX;
  iVar1 = cvt_to_bignum(this_00,(vm_obj_id_t)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    err_throw(0);
  }
  get_objid_ext(0);
  iVar1 = compare_ext((char *)this_00,in_RDI);
  return iVar1;
}

Assistant:

int CVmObjBigNum::compare_to(VMG_ vm_obj_id_t self,
                             const vm_val_t *val) const
{
    vm_val_t val2;

    /* convert it */
    val2 = *val;
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* this type is not convertible to BigNumber - it's not comparable */
        err_throw(VMERR_INVALID_COMPARISON);
    }

    /* compare the values */
    return compare_ext(ext_, get_objid_ext(vmg_ val2.val.obj));
}